

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O0

void ga_sort_scat_long_(Integer *pn,long *v,Integer *i,Integer *j,Integer *base)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  ulong *in_RDI;
  undefined8 *in_R8;
  Integer *p;
  unsigned_long g;
  unsigned_long gap;
  long ib_2;
  long ia_2;
  long dtmp_2;
  long ltmp_2;
  long ib_1;
  long ia_1;
  long dtmp_1;
  long ltmp_1;
  long ib;
  long ia;
  long dtmp;
  long ltmp;
  Integer *base0;
  Integer n;
  Integer *hi;
  Integer *q;
  
  if (1 < (long)*in_RDI) {
    dtmp = (long)*in_RDI >> 1;
    dtmp_1 = (long)(in_R8 + dtmp * 2 + -1);
    if ((*in_RDI & 1) != 0) {
      dtmp_1 = dtmp_1 + 8;
    }
    for (; dtmp != 1; dtmp = dtmp + -1) {
      ia = dtmp;
      ib = (long)(in_R8 + dtmp + -1);
      while (ltmp_1 = ib + ia * 8, (ulong)ltmp_1 <= (ulong)dtmp_1) {
        ia = ia * 2;
        if ((ltmp_1 != dtmp_1) && (*(long *)ltmp_1 < *(long *)(ltmp_1 + 8))) {
          ltmp_1 = ltmp_1 + 8;
          ia = ia + 1;
        }
        if (*(long *)ltmp_1 <= *(long *)ib) break;
        lVar2 = ib - (long)in_R8 >> 3;
        lVar3 = ltmp_1 - (long)in_R8 >> 3;
        uVar1 = *(undefined8 *)ib;
        *(undefined8 *)ib = *(undefined8 *)ltmp_1;
        *(undefined8 *)ltmp_1 = uVar1;
        uVar1 = in_RSI[lVar2];
        in_RSI[lVar2] = in_RSI[lVar3];
        in_RSI[lVar3] = uVar1;
        uVar1 = in_RDX[lVar2];
        in_RDX[lVar2] = in_RDX[lVar3];
        in_RDX[lVar3] = uVar1;
        uVar1 = in_RCX[lVar2];
        in_RCX[lVar2] = in_RCX[lVar3];
        in_RCX[lVar3] = uVar1;
        ib = ltmp_1;
      }
    }
    for (; (undefined8 *)dtmp_1 != in_R8; dtmp_1 = dtmp_1 + -8) {
      ia = 1;
      ib = (long)in_R8;
      while (ltmp_1 = ib + ia * 8, (ulong)ltmp_1 <= (ulong)dtmp_1) {
        ia = ia * 2;
        if ((ltmp_1 != dtmp_1) && (*(long *)ltmp_1 < *(long *)(ltmp_1 + 8))) {
          ltmp_1 = ltmp_1 + 8;
          ia = ia + 1;
        }
        if (*(long *)ltmp_1 <= *(long *)ib) break;
        lVar2 = ib - (long)in_R8 >> 3;
        lVar3 = ltmp_1 - (long)in_R8 >> 3;
        uVar1 = *(undefined8 *)ib;
        *(undefined8 *)ib = *(undefined8 *)ltmp_1;
        *(undefined8 *)ltmp_1 = uVar1;
        uVar1 = in_RSI[lVar2];
        in_RSI[lVar2] = in_RSI[lVar3];
        in_RSI[lVar3] = uVar1;
        uVar1 = in_RDX[lVar2];
        in_RDX[lVar2] = in_RDX[lVar3];
        in_RDX[lVar3] = uVar1;
        uVar1 = in_RCX[lVar2];
        in_RCX[lVar2] = in_RCX[lVar3];
        in_RCX[lVar3] = uVar1;
        ib = ltmp_1;
      }
      lVar2 = dtmp_1 - (long)in_R8 >> 3;
      uVar1 = *in_R8;
      *in_R8 = *(undefined8 *)dtmp_1;
      *(undefined8 *)dtmp_1 = uVar1;
      uVar1 = *in_RSI;
      *in_RSI = in_RSI[lVar2];
      in_RSI[lVar2] = uVar1;
      uVar1 = *in_RDX;
      *in_RDX = in_RDX[lVar2];
      in_RDX[lVar2] = uVar1;
      uVar1 = *in_RCX;
      *in_RCX = in_RCX[lVar2];
      in_RCX[lVar2] = uVar1;
    }
  }
  return;
}

Assistant:

static void ga_sort_scat_long_(pn, v, i, j, base)
     Integer *pn;
     long *v;
     Integer *i;
     Integer *j;
     Integer *base;
{
 
  if (*pn < 2) return;
 
#  undef SWAP
#  define SWAP(a,b) { \
    long ltmp; \
    long dtmp; \
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    dtmp=v[ia]; v[ia]=v[ib]; v[ib]=dtmp; \
    ltmp=i[ia]; i[ia]=i[ib]; i[ib]=ltmp; \
    ltmp=j[ia]; j[ia]=j[ib]; j[ib]=ltmp; \
  }
  INDEX_SORT(base,pn,SWAP);
}